

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

Arg * __thiscall
fmt::internal::PrintfFormatter<wchar_t>::get_arg
          (Arg *__return_storage_ptr__,PrintfFormatter<wchar_t> *this,wchar_t *s,uint arg_index)

{
  uint index;
  LongLong *pLVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  FormatError *this_00;
  char *message;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  
  if (arg_index == 0xffffffff) {
    index = *(uint *)(this + 0x10);
    if ((int)index < 0) {
      *(undefined8 *)&__return_storage_ptr__->type = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
      (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
      (__return_storage_ptr__->super_Value).field_0.string.size = 0;
      message = "cannot switch from manual to automatic argument indexing";
      goto LAB_001c3715;
    }
    *(uint *)(this + 0x10) = index + 1;
    ArgList::operator[](__return_storage_ptr__,(ArgList *)this,index);
    if (__return_storage_ptr__->type == NAMED_ARG) {
      pLVar1 = (LongLong *)(__return_storage_ptr__->super_Value).field_0.pointer;
      __return_storage_ptr__->type = *(Type *)(pLVar1 + 2);
      sVar3 = pLVar1[1];
      (__return_storage_ptr__->super_Value).field_0.long_long_value = *pLVar1;
      (__return_storage_ptr__->super_Value).field_0.string.size = sVar3;
    }
    else if (__return_storage_ptr__->type == NONE) goto LAB_001c36e3;
    message = (char *)0x0;
  }
  else {
    if (*(int *)(this + 0x10) < 1) {
      *(undefined4 *)(this + 0x10) = 0xffffffff;
      message = (char *)0x0;
      ArgList::operator[](__return_storage_ptr__,(ArgList *)this,arg_index - 1);
      if (__return_storage_ptr__->type != NAMED_ARG) {
        if (__return_storage_ptr__->type != NONE) goto LAB_001c3715;
LAB_001c36e3:
        message = "argument index out of range";
        goto LAB_001c3715;
      }
      pwVar2 = (__return_storage_ptr__->super_Value).field_0.wstring.value;
      __return_storage_ptr__->type = pwVar2[4];
      wVar4 = *pwVar2;
      wVar5 = pwVar2[1];
      wVar6 = pwVar2[2];
      wVar7 = pwVar2[3];
    }
    else {
      message = "cannot switch from automatic to manual argument indexing";
      wVar4 = L'\0';
      wVar5 = L'\0';
      wVar6 = L'\0';
      wVar7 = L'\0';
      *(undefined8 *)&__return_storage_ptr__->type = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
    }
    (__return_storage_ptr__->super_Value).field_0.int_value = wVar4;
    *(wchar_t *)((long)&(__return_storage_ptr__->super_Value).field_0 + 4) = wVar5;
    *(wchar_t *)((long)&(__return_storage_ptr__->super_Value).field_0 + 8) = wVar6;
    *(wchar_t *)((long)&(__return_storage_ptr__->super_Value).field_0 + 0xc) = wVar7;
  }
LAB_001c3715:
  if (message == (char *)0x0) {
    return __return_storage_ptr__;
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  if (*s == L'\0') {
    message = "invalid format string";
  }
  FormatError::FormatError(this_00,(CStringRef)message);
  __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Arg fmt::internal::PrintfFormatter<Char>::get_arg(
    const Char *s, unsigned arg_index) {
  (void)s;
  const char *error = 0;
  Arg arg = arg_index == UINT_MAX ?
    next_arg(error) : FormatterBase::get_arg(arg_index - 1, error);
  if (error)
    FMT_THROW(FormatError(!*s ? "invalid format string" : error));
  return arg;
}